

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

int __thiscall QFileSystemModel::rowCount(QFileSystemModel *this,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  QFileSystemModelPrivate *this_00;
  qsizetype qVar3;
  QFileSystemNode *pQVar4;
  QFileSystemModelPrivate *in_RSI;
  QFileSystemNode *parentNode;
  QFileSystemModelPrivate *d;
  int local_4;
  
  this_00 = d_func((QFileSystemModel *)0xaa4efc);
  iVar2 = QModelIndex::column((QModelIndex *)in_RSI);
  if (iVar2 < 1) {
    bVar1 = QModelIndex::isValid((QModelIndex *)this_00);
    if (bVar1) {
      pQVar4 = QFileSystemModelPrivate::node(in_RSI,(QModelIndex *)this_00);
      qVar3 = QList<QString>::size(&pQVar4->visibleChildren);
      local_4 = (int)qVar3;
    }
    else {
      qVar3 = QList<QString>::size(&(this_00->root).visibleChildren);
      local_4 = (int)qVar3;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int QFileSystemModel::rowCount(const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (parent.column() > 0)
        return 0;

    if (!parent.isValid())
        return d->root.visibleChildren.size();

    const QFileSystemModelPrivate::QFileSystemNode *parentNode = d->node(parent);
    return parentNode->visibleChildren.size();
}